

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaligned_vectorization.cpp
# Opt level: O1

int main(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ostream *poVar3;
  double input2 [4];
  double input1 [4];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"address of input1: ",0x13);
  poVar3 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"address of input2: ",0x13);
  poVar3 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  poVar3 = std::ostream::_M_insert<double>(2.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  auVar1._8_8_ = 0x4008000000000000;
  auVar1._0_8_ = 0x4000000000000000;
  auVar1 = vpermilpd_avx(auVar1,1);
  poVar3 = std::ostream::_M_insert<double>(auVar1._0_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = std::ostream::_M_insert<double>(4.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  auVar2._8_8_ = 0x4008000000000000;
  auVar2._0_8_ = 0x4000000000000000;
  auVar1 = vpermilpd_avx(auVar2,1);
  poVar3 = std::ostream::_M_insert<double>(auVar1._0_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return 0;
}

Assistant:

int main() {

  double input1[4] = {1, 1, 1, 1};
  double input2[4] = {1, 2, 3, 4};
  double result[4];

  std::cout << "address of input1: " << input1 << std::endl;
  std::cout << "address of input2: " << input2 << std::endl;

  __m256d a = _mm256_load_pd(input1);
  __m256d b = _mm256_load_pd(input2);
  __m256d c = _mm256_add_pd(a, b);

  _mm256_store_pd(result, c);

  std::cout << result[0] << " " << result[1] << " " << result[2] << " " << result[3] << std::endl;

  return 0;
}